

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::ReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  MessageLite *this_00;
  ulong uVar1;
  MessageLite *this_01;
  
  this_00 = &UnsafeArenaReleaseMessage(this,message,field,factory)->super_MessageLite;
  uVar1 = (message->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  this_01 = this_00;
  if ((this_00 != (MessageLite *)0x0) && (uVar1 != 0)) {
    this_01 = MessageLite::New(this_00,(Arena *)0x0);
    Message::CopyFrom((Message *)this_01,(Message *)this_00);
  }
  return (Message *)this_01;
}

Assistant:

Message* Reflection::ReleaseMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  Message* released = UnsafeArenaReleaseMessage(message, field, factory);
  if (internal::DebugHardenForceCopyInRelease()) {
    released = MaybeForceCopy(message->GetArena(), released);
  }
  if (message->GetArena() != nullptr && released != nullptr) {
    Message* copy_from_arena = released->New();
    copy_from_arena->CopyFrom(*released);
    released = copy_from_arena;
  }
  return released;
}